

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

JavascriptArray *
Js::JavascriptOperators::GetOwnPropertyKeys(Var instance,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  RecyclableObject *obj;
  undefined4 *puVar3;
  JavascriptProxy *local_40;
  JavascriptProxy *proxy;
  RecyclableObject *object;
  ScriptContext *scriptContext_local;
  Var instance_local;
  
  obj = ToObject(instance,scriptContext);
  bVar2 = VarIsCorrectType<Js::RecyclableObject>(obj);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x4ea,"(VarIsCorrectType(object))","VarIsCorrectType(object)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = VarIs<Js::JavascriptProxy>(instance);
  if (bVar2) {
    local_40 = UnsafeVarTo<Js::JavascriptProxy>(instance);
  }
  else {
    local_40 = (JavascriptProxy *)0x0;
  }
  if (local_40 == (JavascriptProxy *)0x0) {
    instance_local = JavascriptObject::CreateOwnStringSymbolPropertiesHelper(obj,scriptContext);
  }
  else {
    instance_local = Js::JavascriptProxy::PropertyKeysTrap(local_40,KeysKind,scriptContext);
  }
  return (JavascriptArray *)instance_local;
}

Assistant:

JavascriptArray* JavascriptOperators::GetOwnPropertyKeys(Var instance, ScriptContext* scriptContext)
    {
        RecyclableObject *object = ToObject(instance, scriptContext);
        AssertOrFailFast(VarIsCorrectType(object));

        JavascriptProxy* proxy = JavascriptOperators::TryFromVar<JavascriptProxy>(instance);
        if (proxy)
        {
            return proxy->PropertyKeysTrap(JavascriptProxy::KeysTrapKind::KeysKind, scriptContext);
        }

        return JavascriptObject::CreateOwnStringSymbolPropertiesHelper(object, scriptContext);
    }